

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcpaddress.cpp
# Opt level: O2

RTPAddress * __thiscall
jrtplib::RTPTCPAddress::CreateCopy(RTPTCPAddress *this,RTPMemoryManager *mgr)

{
  undefined4 uVar1;
  RTPAddress *pRVar2;
  
  pRVar2 = (RTPAddress *)operator_new(0x10,mgr,0x17);
  uVar1 = *(undefined4 *)&(this->super_RTPAddress).field_0xc;
  pRVar2->addresstype = TCPAddress;
  pRVar2->_vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_0014f838;
  *(undefined4 *)&pRVar2->field_0xc = uVar1;
  return pRVar2;
}

Assistant:

RTPAddress *RTPTCPAddress::CreateCopy(RTPMemoryManager *mgr) const
{
	JRTPLIB_UNUSED(mgr); // possibly unused
	RTPTCPAddress *a = RTPNew(mgr,RTPMEM_TYPE_CLASS_RTPADDRESS) RTPTCPAddress(m_socket);
	return a;
}